

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCCtxSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_paramSwitch_e useRowMatchFinder_00;
  undefined1 local_34 [4];
  ZSTD_paramSwitch_e useRowMatchFinder;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params *params_local;
  
  cParams._20_8_ = params;
  ZSTD_getCParamsFromCCtxParams
            ((ZSTD_compressionParameters *)local_34,params,0xffffffffffffffff,0,
             ZSTD_cpm_noAttachDict);
  useRowMatchFinder_00 =
       ZSTD_resolveRowMatchFinderMode
                 (*(ZSTD_paramSwitch_e *)(cParams._20_8_ + 0x90),
                  (ZSTD_compressionParameters *)local_34);
  if (*(int *)(cParams._20_8_ + 0x4c) < 1) {
    params_local = (ZSTD_CCtx_params *)
                   ZSTD_estimateCCtxSize_usingCCtxParams_internal
                             ((ZSTD_compressionParameters *)local_34,
                              (ldmParams_t *)(cParams._20_8_ + 0x60),1,useRowMatchFinder_00,0,0,
                              0xffffffffffffffff,*(int *)(cParams._20_8_ + 0xb8),
                              *(size_t *)(cParams._20_8_ + 0xc0));
  }
  else {
    params_local = (ZSTD_CCtx_params *)0xffffffffffffffff;
  }
  return (size_t)params_local;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder,
                                                                               &cParams);

    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    /* estimateCCtxSize is for one-shot compression. So no buffers should
     * be needed. However, we still allocate two 0-sized buffers, which can
     * take space under ASAN. */
    return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
        &cParams, &params->ldmParams, 1, useRowMatchFinder, 0, 0, ZSTD_CONTENTSIZE_UNKNOWN, params->useSequenceProducer, params->maxBlockSize);
}